

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutils.c
# Opt level: O2

void exchange_bytes(void *a,void *b,size_t size)

{
  undefined1 uVar1;
  size_t sVar2;
  uint8_t *bp;
  uint8_t *ap;
  
  for (sVar2 = 0; size != sVar2; sVar2 = sVar2 + 1) {
    uVar1 = *(undefined1 *)((long)a + sVar2);
    *(undefined1 *)((long)a + sVar2) = *(undefined1 *)((long)b + sVar2);
    *(undefined1 *)((long)b + sVar2) = uVar1;
  }
  return;
}

Assistant:

static void exchange_bytes(void *a, void *b, size_t size) {
    uint8_t *ap = (uint8_t *)a;
    uint8_t *bp = (uint8_t *)b;

    while (size-- != 0) {
        uint8_t t = *ap;
        *ap++ = *bp;
        *bp++ = t;
    }
}